

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

string * HelpMessageGroup(string *__return_storage_ptr__,string *message)

{
  long in_FS_OFFSET;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string((string *)&local_30,message);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"\n\n",&local_51);
  std::operator+(__return_storage_ptr__,&local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string HelpMessageGroup(const std::string &message) {
    return std::string(message) + std::string("\n\n");
}